

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O0

unique_ptr<float[],_std::default_delete<float[]>_> __thiscall
qclab::dense::alloc_unique_array<float>(dense *this,int64_t size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  float *__p;
  pointer pfVar3;
  unique_ptr<float[],_std::default_delete<float[]>_> local_20;
  unique_ptr<float[],_std::default_delete<float[]>_> mem;
  int64_t size_local;
  
  mem._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)size;
  if (size < 1) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                  ,0x12,"auto qclab::dense::alloc_unique_array(const int64_t) [T = float]");
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = size;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  __p = (float *)operator_new__(uVar2);
  std::unique_ptr<float[],std::default_delete<float[]>>::
  unique_ptr<float*,std::default_delete<float[]>,void,bool>
            ((unique_ptr<float[],std::default_delete<float[]>> *)&local_20,__p);
  pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&local_20);
  if (pfVar3 != (pointer)0x0) {
    std::unique_ptr<float[],_std::default_delete<float[]>_>::unique_ptr
              ((unique_ptr<float[],_std::default_delete<float[]>_> *)this,&local_20);
    std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&local_20);
    return (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)this;
  }
  __assert_fail("mem.get() != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                ,0x14,"auto qclab::dense::alloc_unique_array(const int64_t) [T = float]");
}

Assistant:

inline auto alloc_unique_array( const int64_t size ) {
      assert( size > 0 ) ;
      std::unique_ptr< T[] > mem( new T[size] ) ;
      assert( mem.get() != nullptr ) ;
      return mem ;
    }